

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample1DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,IVec2 *offset)

{
  WrapMode size;
  WrapMode mode;
  int j;
  int iVar1;
  undefined4 in_register_00000014;
  Sampler *sampler_00;
  int i;
  IVec2 *in_R8;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vec4 VVar3;
  Vector<float,_4> VVar4;
  Vec4 VVar5;
  Vec4 p0;
  Vec4 p1;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  tcu local_40 [16];
  Vec4 VVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  
  sampler_00 = (Sampler *)CONCAT44(in_register_00000014,filter);
  if (sampler_00->normalizedCoords == true) {
    s = unnormalize(sampler_00->wrapS,s,sampler->wrapR);
  }
  if ((int)offset != 1) {
    if ((int)offset == 0) {
      VVar3 = sampleNearest1D((tcu *)this,(ConstPixelBufferAccess *)sampler,sampler_00,s,in_R8);
      VVar6.m_data[0] = VVar3.m_data[0];
      auVar9._4_4_ = VVar3.m_data[1];
      register0x00001240 = VVar3.m_data[2];
      register0x00001244 = VVar3.m_data[3];
      return (Vec4)VVar6.m_data;
    }
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
    auVar8._4_4_ = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    register0x00001240 = (float)(int)in_XMM1_Qa;
    register0x00001244 = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    return (Vec4)VVar3.m_data;
  }
  size = sampler->wrapR;
  fVar2 = floorf(s + -0.5);
  iVar1 = in_R8->m_data[0];
  mode = sampler_00->wrapS;
  j = wrap(mode,iVar1 + (int)fVar2,size);
  iVar1 = wrap(mode,iVar1 + (int)fVar2 + 1,size);
  i = (int)sampler;
  if (mode == CLAMP_TO_BORDER) {
    if (j < (int)size && -1 < j) {
      lookup((ConstPixelBufferAccess *)local_70,i,j,in_R8->m_data[1]);
    }
    else {
      lookupBorder((tcu *)local_70,(TextureFormat *)sampler,sampler_00);
    }
    if ((int)size <= iVar1 || iVar1 < 0) {
      lookupBorder((tcu *)local_60,(TextureFormat *)sampler,sampler_00);
      goto LAB_01604521;
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)local_70,i,j,in_R8->m_data[1]);
  }
  lookup((ConstPixelBufferAccess *)local_60,i,iVar1,in_R8->m_data[1]);
LAB_01604521:
  fVar2 = (s + -0.5) - fVar2;
  tcu::operator*(local_40,1.0 - fVar2,(Vector<float,_4> *)local_70);
  tcu::operator*((tcu *)(local_60 + 0x10),fVar2,(Vector<float,_4> *)local_60);
  VVar4 = tcu::operator+((tcu *)this,(Vector<float,_4> *)local_40,
                         (Vector<float,_4> *)(local_60 + 0x10));
  VVar5.m_data[0] = VVar4.m_data[0];
  auVar7._4_4_ = VVar4.m_data[1];
  register0x00001240 = VVar4.m_data[2];
  register0x00001244 = VVar4.m_data[3];
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample1DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, const IVec2& offset) const
{
	// check selected layer exists
	// \note offset.x is X offset, offset.y is the selected layer
	DE_ASSERT(de::inBounds(offset.y(), 0, m_size.y()));

	// Non-normalized coordinates.
	float u = s;

	if (sampler.normalizedCoords)
		u = unnormalize(sampler.wrapS, s, m_size.x());

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest1D	(*this, sampler, u, offset);
		case Sampler::LINEAR:	return sampleLinear1D	(*this, sampler, u, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}